

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lobject.c
# Opt level: O1

size_t luaO_str2num(char *s,TValue *o)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  byte *pbVar4;
  byte *pbVar5;
  byte *pbVar6;
  char *pcVar7;
  size_t sVar8;
  lconv *plVar9;
  Value VVar10;
  lu_byte lVar11;
  uint uVar12;
  Value VVar13;
  byte bVar14;
  int iVar15;
  ulong uVar16;
  TValue *io;
  lua_Number n;
  Value local_100;
  char local_f8 [208];
  
  pbVar5 = (byte *)s;
  do {
    pbVar4 = pbVar5;
    bVar14 = *pbVar4;
    pbVar5 = pbVar4 + 1;
  } while ((""[(ulong)bVar14 + 1] & 8) != 0);
  pbVar6 = pbVar5;
  if ((bVar14 == 0x2b) || (pbVar6 = pbVar4, bVar14 != 0x2d)) {
    iVar15 = 7;
    bVar3 = true;
  }
  else {
    iVar15 = 8;
    bVar3 = false;
    pbVar6 = pbVar5;
  }
  uVar16 = (ulong)*pbVar6;
  if ((uVar16 == 0x30) && ((pbVar6[1] | 0x20) == 0x78)) {
    uVar16 = (ulong)pbVar6[2];
    pbVar6 = pbVar6 + 2;
    if ((""[uVar16 + 1] & 0x10) == 0) {
LAB_00112546:
      bVar2 = false;
      VVar13.gc = (GCObject *)0x0;
    }
    else {
      VVar13.gc = (GCObject *)0x0;
      do {
        bVar14 = (byte)uVar16;
        if ((""[(long)(char)bVar14 + 1] & 2) == 0) {
          bVar14 = (bVar14 | 0x20) + 0xa9;
        }
        else {
          bVar14 = bVar14 - 0x30;
        }
        VVar13.gc = (GCObject *)((ulong)bVar14 + VVar13.i * 0x10);
        uVar16 = (ulong)pbVar6[1];
        pbVar6 = pbVar6 + 1;
      } while ((""[uVar16 + 1] & 0x10) != 0);
      bVar2 = true;
    }
  }
  else {
    if ((""[uVar16 + 1] & 2) == 0) goto LAB_00112546;
    bVar2 = true;
    VVar13.gc = (GCObject *)0x0;
    do {
      uVar12 = (int)(char)uVar16 - 0x30;
      if ((VVar13.gc < (GCObject *)0xccccccccccccccc) ||
         ((int)uVar12 <= iVar15 && VVar13.gc == (GCObject *)0xccccccccccccccc)) {
        VVar13.gc = (GCObject *)((ulong)uVar12 + VVar13.i * 10);
        bVar1 = true;
        bVar2 = false;
      }
      else {
        bVar1 = false;
      }
      if (!bVar1) {
        pbVar6 = (byte *)0x0;
        VVar10 = (Value)"";
        goto LAB_001125ea;
      }
      uVar16 = (ulong)pbVar6[1];
      pbVar6 = pbVar6 + 1;
    } while ((""[uVar16 + 1] & 2) != 0);
    bVar2 = !bVar2;
  }
  pbVar6 = pbVar6 + -1;
  do {
    bVar14 = pbVar6[1];
    pbVar6 = pbVar6 + 1;
  } while ((""[(ulong)bVar14 + 1] & 8) != 0);
  VVar10.i._1_7_ = 0x12bc;
  VVar10.ub = bVar14 != 0;
  if (!bVar2 || bVar14 != 0) {
    pbVar6 = (byte *)0x0;
  }
  else {
    VVar10.i = -VVar13.i;
    if (bVar3) {
      VVar10 = VVar13;
    }
  }
LAB_001125ea:
  lVar11 = '\x03';
  if (pbVar6 != (byte *)0x0) goto LAB_00112638;
  pbVar5 = (byte *)strpbrk(s,".xXnN");
  if (pbVar5 == (byte *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *pbVar5 | 0x20;
  }
  if (uVar12 == 0x6e) {
LAB_00112614:
    pbVar6 = (byte *)0x0;
  }
  else {
    pbVar6 = (byte *)l_str2dloc(s,&local_100.n,uVar12);
    if (pbVar6 == (byte *)0x0) {
      pcVar7 = strchr(s,0x2e);
      if ((pcVar7 == (char *)0x0) || (sVar8 = strlen(s), 200 < sVar8)) goto LAB_00112614;
      strcpy(local_f8,s);
      plVar9 = localeconv();
      pcVar7[(long)(local_f8 + -(long)s)] = *plVar9->decimal_point;
      pcVar7 = l_str2dloc(local_f8,&local_100.n,uVar12);
      pbVar6 = (byte *)(s + ((long)pcVar7 - (long)local_f8));
      if (pcVar7 == (char *)0x0) {
        pbVar6 = (byte *)0x0;
      }
    }
  }
  if (pbVar6 == (byte *)0x0) {
    return 0;
  }
  lVar11 = '\x13';
  VVar10 = local_100;
LAB_00112638:
  o->value_ = VVar10;
  o->tt_ = lVar11;
  return (size_t)(pbVar6 + (1 - (long)s));
}

Assistant:

size_t luaO_str2num (const char *s, TValue *o) {
  lua_Integer i; lua_Number n;
  const char *e;
  if ((e = l_str2int(s, &i)) != NULL) {  /* try as an integer */
    setivalue(o, i);
  }
  else if ((e = l_str2d(s, &n)) != NULL) {  /* else try as a float */
    setfltvalue(o, n);
  }
  else
    return 0;  /* conversion failed */
  return ct_diff2sz(e - s) + 1;  /* success; return string size */
}